

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_util.c
# Opt level: O1

char * archive_version_details(void)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  
  archive_version_details::str.s = (char *)0x0;
  archive_version_details::str.length = 0;
  archive_version_details::str.buffer_length = 0;
  archive_strcat(&archive_version_details::str,"libarchive 3.1.2");
  archive_strcat(&archive_version_details::str," zlib/");
  archive_strcat(&archive_version_details::str,"1.2.3");
  archive_strcat(&archive_version_details::str," liblzma/");
  archive_strcat(&archive_version_details::str,"5.0.5");
  __s = BZ2_bzlibVersion();
  pcVar1 = strchr(__s,0x2c);
  if (pcVar1 == (char *)0x0) {
    sVar2 = strlen(__s);
    pcVar1 = __s + sVar2;
  }
  archive_strcat(&archive_version_details::str," bz2lib/");
  archive_strncat(&archive_version_details::str,__s,(long)pcVar1 - (long)__s);
  return archive_version_details::str.s;
}

Assistant:

const char *
archive_version_details(void)
{
	static struct archive_string str;
	static int init = 0;

	if (!init) {
		archive_string_init(&str);

		archive_strcat(&str, ARCHIVE_VERSION_STRING);
#ifdef HAVE_ZLIB_H
		archive_strcat(&str, " zlib/");
		archive_strcat(&str, ZLIB_VERSION);
#endif
#ifdef HAVE_LZMA_H
		archive_strcat(&str, " liblzma/");
		archive_strcat(&str, LZMA_VERSION_STRING);
#endif
#ifdef HAVE_BZLIB_H
		{
			const char *p = BZ2_bzlibVersion();
			const char *sep = strchr(p, ',');
			if (sep == NULL)
				sep = p + strlen(p);
			archive_strcat(&str, " bz2lib/");
			archive_strncat(&str, p, sep - p);
		}
#endif
	    }
	return str.s;
}